

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O3

UINT8 SndEmu_GetDeviceFunc
                (DEV_DEF *devDef,UINT8 funcType,UINT8 rwType,UINT16 user,void **retFuncPtr)

{
  DEVDEF_RWFUNC *pDVar1;
  DEVDEF_RWFUNC *pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  UINT8 UVar7;
  
  pDVar1 = devDef->rwFuncs;
  UVar7 = 0xf8;
  if (pDVar1->funcPtr != (void *)0x0) {
    iVar3 = 0;
    uVar4 = 0;
    pDVar2 = pDVar1;
    uVar5 = 1;
    do {
      if (((pDVar2->funcType == funcType) && (pDVar2->rwType == rwType)) &&
         ((user == 0 || (pDVar2->user == user)))) {
        if (iVar3 == 0) {
          uVar4 = uVar5 - 1;
        }
        iVar3 = iVar3 + 1;
      }
      pDVar2 = pDVar1 + uVar5;
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (pDVar1[uVar6].funcPtr != (void *)0x0);
    if (iVar3 != 0) {
      *retFuncPtr = pDVar1[uVar4].funcPtr;
      UVar7 = iVar3 != 1;
    }
  }
  return UVar7;
}

Assistant:

UINT8 SndEmu_GetDeviceFunc(const DEV_DEF* devDef, UINT8 funcType, UINT8 rwType, UINT16 user, void** retFuncPtr)
{
	UINT32 curFunc;
	const DEVDEF_RWFUNC* tempFnc;
	UINT32 firstFunc;
	UINT32 foundFunc;
	
	foundFunc = 0;
	firstFunc = 0;
	for (curFunc = 0; devDef->rwFuncs[curFunc].funcPtr != NULL; curFunc ++)
	{
		tempFnc = &devDef->rwFuncs[curFunc];
		if (tempFnc->funcType == funcType && tempFnc->rwType == rwType)
		{
			if (! user || user == tempFnc->user)
			{
				if (foundFunc == 0)
					firstFunc = curFunc;
				foundFunc ++;
			}
		}
	}
	if (foundFunc == 0)
		return EERR_NOT_FOUND;
	*retFuncPtr = devDef->rwFuncs[firstFunc].funcPtr;
	if (foundFunc == 1)
		return EERR_OK;
	else
		return EERR_MORE_FOUND;	// found multiple matching functions
}